

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChCOBB.cpp
# Opt level: O1

bool chrono::collision::CHOBB::OBB_Overlap(ChMatrix33<double> *B,Vector *T,Vector *a,Vector *b)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  bool bVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  
  if (OBB_Overlap(chrono::ChMatrix33<double>&,chrono::ChVector<double>,chrono::ChVector<double>,chrono::ChVector<double>)
      ::Bf == '\0') {
    OBB_Overlap();
  }
  dVar1 = (B->super_Matrix<double,_3,_3,_1,_3,_3>).
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  auVar28._8_8_ = 0;
  auVar28._0_8_ = dVar1;
  dVar2 = (B->super_Matrix<double,_3,_3,_1,_3,_3>).
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
  auVar24._8_8_ = 0;
  auVar24._0_8_ = dVar2;
  auVar35._8_8_ = 0x8000000000000000;
  auVar35._0_8_ = 0x8000000000000000;
  auVar23._0_8_ = -dVar1;
  auVar23._8_8_ = 0x8000000000000000;
  auVar28 = vmaxsd_avx(auVar23,auVar28);
  auVar23 = vaddsd_avx512f(auVar28,ZEXT816(0x3eb0c6f7a0b5ed8d));
  auVar26._0_8_ = -dVar2;
  auVar26._8_8_ = 0x8000000000000000;
  auVar28 = vmaxsd_avx(auVar26,auVar24);
  auVar24 = vaddsd_avx512f(auVar28,ZEXT816(0x3eb0c6f7a0b5ed8d));
  dVar1 = (B->super_Matrix<double,_3,_3,_1,_3,_3>).
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
  auVar25._8_8_ = 0;
  auVar25._0_8_ = dVar1;
  auVar30._0_8_ = -dVar1;
  auVar30._8_8_ = 0x8000000000000000;
  auVar28 = vmaxsd_avx(auVar30,auVar25);
  auVar30 = ZEXT816(0x3eb0c6f7a0b5ed8d);
  auVar25 = vaddsd_avx512f(auVar28,auVar30);
  auVar46._8_8_ = 0;
  auVar46._0_8_ = T->m_data[0];
  auVar40._0_8_ = -T->m_data[0];
  auVar40._8_8_ = 0x8000000000000000;
  auVar28 = vmaxsd_avx(auVar40,auVar46);
  auVar39._8_8_ = 0;
  auVar39._0_8_ = a->m_data[0];
  auVar38._8_8_ = 0;
  auVar38._0_8_ = b->m_data[0];
  auVar37._8_8_ = 0;
  auVar37._0_8_ = b->m_data[1];
  auVar26 = vfmadd213sd_fma(auVar23,auVar38,auVar39);
  auVar26 = vfmadd231sd_fma(auVar26,auVar37,auVar24);
  auVar42._8_8_ = 0;
  auVar42._0_8_ = b->m_data[2];
  auVar26 = vfmadd231sd_fma(auVar26,auVar42,auVar25);
  bVar12 = auVar28._0_8_ <= auVar26._0_8_;
  if (bVar12) {
    dVar1 = (B->super_Matrix<double,_3,_3,_1,_3,_3>).
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
    auVar27._8_8_ = 0;
    auVar27._0_8_ = dVar1;
    auVar32._0_8_ = -dVar1;
    auVar32._8_8_ = 0x8000000000000000;
    auVar28 = vmaxsd_avx(auVar32,auVar27);
    auVar26 = vaddsd_avx512f(auVar28,auVar30);
    dVar1 = (B->super_Matrix<double,_3,_3,_1,_3,_3>).
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
    auVar31._8_8_ = 0;
    auVar31._0_8_ = dVar1;
    auVar33._0_8_ = -dVar1;
    auVar33._8_8_ = 0x8000000000000000;
    auVar28 = vmaxsd_avx(auVar33,auVar31);
    auVar27 = vaddsd_avx512f(auVar28,auVar30);
    auVar50._8_8_ = 0;
    auVar50._0_8_ =
         (B->super_Matrix<double,_3,_3,_1,_3,_3>).
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
    dVar1 = (B->super_Matrix<double,_3,_3,_1,_3,_3>).
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
    auVar45._8_8_ = 0;
    auVar45._0_8_ = T->m_data[1];
    dVar2 = T->m_data[2];
    auVar34._8_8_ = 0;
    auVar34._0_8_ = dVar1;
    auVar28 = vmulsd_avx512f(auVar45,auVar34);
    auVar28 = vfmadd231sd_fma(auVar28,auVar46,auVar50);
    dVar3 = (B->super_Matrix<double,_3,_3,_1,_3,_3>).
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
    auVar56._8_8_ = 0;
    auVar56._0_8_ = dVar2;
    auVar66._8_8_ = 0;
    auVar66._0_8_ = dVar3;
    auVar28 = vfmadd231sd_avx512f(auVar28,auVar56,auVar66);
    auVar29._8_8_ = 0x8000000000000000;
    auVar29._0_8_ = 0x8000000000000000;
    auVar29 = vxorpd_avx512vl(auVar28,auVar29);
    auVar28 = vmaxsd_avx(auVar29,auVar28);
    auVar29 = vfmadd213sd_avx512f(auVar23,auVar39,auVar38);
    dVar4 = a->m_data[1];
    auVar47._8_8_ = 0;
    auVar47._0_8_ = dVar4;
    dVar5 = a->m_data[2];
    auVar29 = vfmadd231sd_avx512f(auVar29,auVar47,auVar26);
    auVar53._8_8_ = 0;
    auVar53._0_8_ = dVar5;
    vfmadd231sd_avx512f(auVar29,auVar53,auVar27);
    vucomisd_avx512f(auVar28);
    if (bVar12) {
      auVar48._8_8_ = 0;
      auVar48._0_8_ =
           (B->super_Matrix<double,_3,_3,_1,_3,_3>).
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
      auVar28 = vxorpd_avx512vl(auVar48,auVar35);
      auVar28 = vmaxsd_avx512f(auVar28,auVar48);
      auVar28 = vaddsd_avx512f(auVar28,auVar30);
      auVar49._8_8_ = 0;
      auVar49._0_8_ =
           (B->super_Matrix<double,_3,_3,_1,_3,_3>).
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
      auVar30 = vxorpd_avx512vl(auVar49,auVar35);
      auVar30 = vmaxsd_avx512f(auVar30,auVar49);
      auVar32 = ZEXT816(0x3eb0c6f7a0b5ed8d);
      auVar30 = vaddsd_avx512f(auVar30,auVar32);
      auVar13._8_8_ = 0x8000000000000000;
      auVar13._0_8_ = 0x8000000000000000;
      auVar29 = vxorpd_avx512vl(auVar45,auVar13);
      auVar29 = vmaxsd_avx512f(auVar29,auVar45);
      auVar31 = vfmadd213sd_avx512f(auVar26,auVar38,auVar47);
      auVar31 = vfmadd231sd_avx512f(auVar31,auVar37,auVar28);
      vfmadd231sd_avx512f(auVar31,auVar42,auVar30);
      vucomisd_avx512f(auVar29);
      if (bVar12) {
        auVar52._8_8_ = 0;
        auVar52._0_8_ =
             (B->super_Matrix<double,_3,_3,_1,_3,_3>).
             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
        auVar29 = vxorpd_avx512vl(auVar52,auVar35);
        auVar29 = vmaxsd_avx512f(auVar29,auVar52);
        auVar29 = vaddsd_avx512f(auVar29,auVar32);
        auVar59._8_8_ = 0;
        auVar59._0_8_ =
             (B->super_Matrix<double,_3,_3,_1,_3,_3>).
             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
        auVar31 = vxorpd_avx512vl(auVar59,auVar35);
        auVar31 = vmaxsd_avx512f(auVar31,auVar59);
        auVar31 = vaddsd_avx512f(auVar31,auVar32);
        auVar14._8_8_ = 0x8000000000000000;
        auVar14._0_8_ = 0x8000000000000000;
        auVar32 = vxorpd_avx512vl(auVar56,auVar14);
        auVar57._8_8_ = 0;
        auVar57._0_8_ = dVar2;
        auVar32 = vmaxsd_avx512f(auVar32,auVar57);
        auVar33 = vfmadd213sd_avx512f(auVar27,auVar38,auVar53);
        auVar33 = vfmadd231sd_avx512f(auVar33,auVar37,auVar29);
        vfmadd231sd_avx512f(auVar33,auVar42,auVar31);
        vucomisd_avx512f(auVar32);
        if (bVar12) {
          dVar6 = (B->super_Matrix<double,_3,_3,_1,_3,_3>).
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                  array[1];
          dVar7 = (B->super_Matrix<double,_3,_3,_1,_3,_3>).
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                  array[4];
          auVar64._8_8_ = 0;
          auVar64._0_8_ = dVar7;
          auVar32 = vmulsd_avx512f(auVar45,auVar64);
          auVar60._8_8_ = 0;
          auVar60._0_8_ = dVar6;
          auVar32 = vfmadd231sd_avx512f(auVar32,auVar46,auVar60);
          dVar8 = (B->super_Matrix<double,_3,_3,_1,_3,_3>).
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                  array[7];
          auVar70._8_8_ = 0;
          auVar70._0_8_ = dVar8;
          auVar32 = vfmadd231sd_avx512f(auVar32,auVar57,auVar70);
          auVar15._8_8_ = 0x8000000000000000;
          auVar15._0_8_ = 0x8000000000000000;
          auVar33 = vxorpd_avx512vl(auVar32,auVar15);
          auVar32 = vmaxsd_avx512f(auVar33,auVar32);
          auVar33 = vfmadd213sd_avx512f(auVar24,auVar39,auVar37);
          auVar33 = vfmadd231sd_avx512f(auVar33,auVar47,auVar28);
          auVar54._8_8_ = 0;
          auVar54._0_8_ = dVar5;
          vfmadd231sd_avx512f(auVar33,auVar54,auVar29);
          vucomisd_avx512f(auVar32);
          if (bVar12) {
            dVar9 = (B->super_Matrix<double,_3,_3,_1,_3,_3>).
                    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                    array[2];
            dVar10 = (B->super_Matrix<double,_3,_3,_1,_3,_3>).
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                     array[5];
            auVar68._8_8_ = 0;
            auVar68._0_8_ = dVar10;
            auVar32 = vmulsd_avx512f(auVar45,auVar68);
            auVar62._8_8_ = 0;
            auVar62._0_8_ = dVar9;
            auVar32 = vfmadd231sd_avx512f(auVar32,auVar46,auVar62);
            dVar11 = (B->super_Matrix<double,_3,_3,_1,_3,_3>).
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                     array[8];
            auVar72._8_8_ = 0;
            auVar72._0_8_ = dVar11;
            auVar32 = vfmadd231sd_avx512f(auVar32,auVar57,auVar72);
            auVar16._8_8_ = 0x8000000000000000;
            auVar16._0_8_ = 0x8000000000000000;
            auVar33 = vxorpd_avx512vl(auVar32,auVar16);
            auVar32 = vmaxsd_avx512f(auVar33,auVar32);
            auVar33 = vfmadd213sd_avx512f(auVar25,auVar39,auVar42);
            auVar33 = vfmadd231sd_avx512f(auVar33,auVar47,auVar30);
            vfmadd231sd_avx512f(auVar33,auVar54,auVar31);
            vucomisd_avx512f(auVar32);
            if (bVar12) {
              auVar32 = vmulsd_avx512f(auVar66,auVar45);
              auVar32 = vfmsub231sd_avx512f(auVar32,auVar57,auVar34);
              auVar33 = vxorpd_avx512vl(auVar32,auVar35);
              auVar32 = vmaxsd_avx512f(auVar33,auVar32);
              auVar33 = vmulsd_avx512f(auVar26,auVar54);
              auVar33 = vfmadd231sd_avx512f(auVar33,auVar47,auVar27);
              auVar33 = vfmadd231sd_avx512f(auVar33,auVar37,auVar25);
              vfmadd231sd_avx512f(auVar33,auVar42,auVar24);
              vucomisd_avx512f(auVar32);
              if (bVar12) {
                auVar32 = vxorpd_avx512vl(auVar45,auVar35);
                auVar33 = vmulsd_avx512f(auVar70,auVar32);
                auVar58._8_8_ = 0;
                auVar58._0_8_ = dVar2;
                auVar33 = vfmadd231sd_avx512f(auVar33,auVar58,auVar64);
                auVar17._8_8_ = 0x8000000000000000;
                auVar17._0_8_ = 0x8000000000000000;
                auVar34 = vxorpd_avx512vl(auVar33,auVar17);
                auVar33 = vmaxsd_avx512f(auVar34,auVar33);
                auVar34 = vmulsd_avx512f(auVar28,auVar54);
                auVar34 = vfmadd231sd_avx512f(auVar34,auVar47,auVar29);
                auVar34 = vfmadd231sd_avx512f(auVar34,auVar38,auVar25);
                vfmadd231sd_avx512f(auVar34,auVar42,auVar23);
                vucomisd_avx512f(auVar33);
                if (bVar12) {
                  auVar32 = vmulsd_avx512f(auVar72,auVar32);
                  auVar32 = vfmadd231sd_avx512f(auVar32,auVar58,auVar68);
                  auVar18._8_8_ = 0x8000000000000000;
                  auVar18._0_8_ = 0x8000000000000000;
                  auVar33 = vxorpd_avx512vl(auVar32,auVar18);
                  auVar32 = vmaxsd_avx512f(auVar33,auVar32);
                  auVar55._8_8_ = 0;
                  auVar55._0_8_ = dVar5;
                  auVar33 = vmulsd_avx512f(auVar30,auVar55);
                  auVar33 = vfmadd231sd_avx512f(auVar33,auVar47,auVar31);
                  auVar33 = vfmadd231sd_avx512f(auVar33,auVar38,auVar24);
                  vfmadd231sd_avx512f(auVar33,auVar37,auVar23);
                  vucomisd_avx512f(auVar32);
                  if (bVar12) {
                    auVar32 = vmulsd_avx512f(auVar50,auVar58);
                    auVar67._8_8_ = 0;
                    auVar67._0_8_ = dVar3;
                    auVar32 = vfmsub213sd_avx512f(auVar67,auVar46,auVar32);
                    auVar33 = vxorpd_avx512vl(auVar32,auVar35);
                    auVar32 = vmaxsd_avx512f(auVar33,auVar32);
                    auVar33 = vmulsd_avx512f(auVar23,auVar55);
                    auVar33 = vfmadd231sd_avx512f(auVar33,auVar39,auVar27);
                    auVar33 = vfmadd231sd_avx512f(auVar33,auVar37,auVar30);
                    vfmadd231sd_avx512f(auVar33,auVar42,auVar28);
                    vucomisd_avx512f(auVar32);
                    if (bVar12) {
                      auVar35 = vxorpd_avx512vl(auVar58,auVar35);
                      auVar32 = vmulsd_avx512f(auVar60,auVar35);
                      auVar71._8_8_ = 0;
                      auVar71._0_8_ = dVar8;
                      auVar32 = vfmadd213sd_avx512f(auVar71,auVar46,auVar32);
                      auVar19._8_8_ = 0x8000000000000000;
                      auVar19._0_8_ = 0x8000000000000000;
                      auVar33 = vxorpd_avx512vl(auVar32,auVar19);
                      auVar32 = vmaxsd_avx512f(auVar33,auVar32);
                      auVar33 = vmulsd_avx512f(auVar24,auVar55);
                      auVar33 = vfmadd231sd_avx512f(auVar33,auVar39,auVar29);
                      auVar33 = vfmadd231sd_avx512f(auVar33,auVar38,auVar30);
                      vfmadd231sd_avx512f(auVar33,auVar42,auVar26);
                      vucomisd_avx512f(auVar32);
                      if (bVar12) {
                        auVar35 = vmulsd_avx512f(auVar62,auVar35);
                        auVar73._8_8_ = 0;
                        auVar73._0_8_ = dVar11;
                        auVar35 = vfmadd213sd_avx512f(auVar73,auVar46,auVar35);
                        auVar20._8_8_ = 0x8000000000000000;
                        auVar20._0_8_ = 0x8000000000000000;
                        auVar32 = vxorpd_avx512vl(auVar35,auVar20);
                        auVar35 = vmaxsd_avx512f(auVar32,auVar35);
                        auVar32 = vmulsd_avx512f(auVar25,auVar55);
                        auVar32 = vfmadd231sd_avx512f(auVar32,auVar39,auVar31);
                        auVar32 = vfmadd231sd_avx512f(auVar32,auVar38,auVar28);
                        vfmadd231sd_avx512f(auVar32,auVar37,auVar26);
                        vucomisd_avx512f(auVar35);
                        if (bVar12) {
                          auVar51._8_8_ = 0;
                          auVar51._0_8_ = dVar1;
                          auVar35 = vmulsd_avx512f(auVar51,auVar46);
                          auVar35 = vfmsub213sd_fma(auVar50,auVar45,auVar35);
                          auVar43._0_8_ = auVar35._0_8_ ^ 0x8000000000000000;
                          auVar43._8_8_ = auVar35._8_8_ ^ 0x8000000000000000;
                          auVar35 = vmaxsd_avx(auVar43,auVar35);
                          auVar44._8_8_ = 0;
                          auVar44._0_8_ = auVar23._0_8_ * dVar4;
                          auVar26 = vfmadd213sd_fma(auVar26,auVar39,auVar44);
                          auVar26 = vfmadd231sd_avx512f(auVar26,auVar37,auVar31);
                          auVar26 = vfmadd231sd_avx512f(auVar26,auVar42,auVar29);
                          if (auVar35._0_8_ <= auVar26._0_8_) {
                            auVar65._8_8_ = 0;
                            auVar65._0_8_ = dVar7;
                            auVar26 = vmulsd_avx512f(auVar65,auVar40);
                            auVar61._8_8_ = 0;
                            auVar61._0_8_ = dVar6;
                            auVar26 = vfmadd213sd_avx512f(auVar61,auVar45,auVar26);
                            auVar21._8_8_ = 0x8000000000000000;
                            auVar21._0_8_ = 0x8000000000000000;
                            auVar23 = vxorpd_avx512vl(auVar26,auVar21);
                            auVar26 = vmaxsd_avx512f(auVar23,auVar26);
                            auVar41._8_8_ = 0;
                            auVar41._0_8_ = dVar4 * auVar24._0_8_;
                            auVar28 = vfmadd213sd_avx512f(auVar28,auVar39,auVar41);
                            auVar28 = vfmadd213sd_avx512f(auVar31,auVar38,auVar28);
                            auVar28 = vfmadd213sd_avx512f(auVar42,auVar27,auVar28);
                            if (auVar26._0_8_ <= auVar28._0_8_) {
                              auVar69._8_8_ = 0;
                              auVar69._0_8_ = dVar10;
                              auVar28 = vmulsd_avx512f(auVar69,auVar40);
                              auVar63._8_8_ = 0;
                              auVar63._0_8_ = dVar9;
                              auVar28 = vfmadd213sd_avx512f(auVar63,auVar45,auVar28);
                              auVar22._8_8_ = 0x8000000000000000;
                              auVar22._0_8_ = 0x8000000000000000;
                              auVar26 = vxorpd_avx512vl(auVar28,auVar22);
                              auVar26 = vmaxsd_avx512f(auVar26,auVar28);
                              auVar36._8_8_ = 0;
                              auVar36._0_8_ = dVar4 * auVar25._0_8_;
                              auVar28 = vfmadd213sd_fma(auVar30,auVar39,auVar36);
                              auVar28 = vfmadd213sd_avx512f(auVar29,auVar38,auVar28);
                              auVar28 = vfmadd213sd_avx512f(auVar27,auVar37,auVar28);
                              return auVar26._0_8_ <= auVar28._0_8_;
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return false;
}

Assistant:

bool CHOBB::OBB_Overlap(ChMatrix33<>& B, Vector T, Vector a, Vector b) {
    double t, s;
    int r;
    static ChMatrix33<> Bf;
    const double reps = (double)1e-6;

    // Vector& a = b1->d;
    // Vector& b = b2->d;

    // Bf = fabs(B)
    Bf(0, 0) = myfabs(B(0, 0));
    Bf(0, 0) += reps;
    Bf(0, 1) = myfabs(B(0, 1));
    Bf(0, 1) += reps;
    Bf(0, 2) = myfabs(B(0, 2));
    Bf(0, 2) += reps;
    Bf(1, 0) = myfabs(B(1, 0));
    Bf(1, 0) += reps;
    Bf(1, 1) = myfabs(B(1, 1));
    Bf(1, 1) += reps;
    Bf(1, 2) = myfabs(B(1, 2));
    Bf(1, 2) += reps;
    Bf(2, 0) = myfabs(B(2, 0));
    Bf(2, 0) += reps;
    Bf(2, 1) = myfabs(B(2, 1));
    Bf(2, 1) += reps;
    Bf(2, 2) = myfabs(B(2, 2));
    Bf(2, 2) += reps;

    // if any of these tests are one-sided, then the polyhedron are disjoint
    r = 1;

    // A1 x A2 = A0
    t = myfabs(T.x());

    r &= (t <= (a.x() + b.x() * Bf(0, 0) + b.y() * Bf(0, 1) + b.z() * Bf(0, 2)));
    if (!r)
        return false;

    // B1 x B2 = B0
    s = T.x() * B(0, 0) + T.y() * B(1, 0) + T.z() * B(2, 0);
    t = myfabs(s);

    r &= (t <= (b.x() + a.x() * Bf(0, 0) + a.y() * Bf(1, 0) + a.z() * Bf(2, 0)));
    if (!r)
        return false;

    // A2 x A0 = A1
    t = myfabs(T.y());

    r &= (t <= (a.y() + b.x() * Bf(1, 0) + b.y() * Bf(1, 1) + b.z() * Bf(1, 2)));
    if (!r)
        return false;

    // A0 x A1 = A2
    t = myfabs(T.z());

    r &= (t <= (a.z() + b.x() * Bf(2, 0) + b.y() * Bf(2, 1) + b.z() * Bf(2, 2)));
    if (!r)
        return false;

    // B2 x B0 = B1
    s = T.x() * B(0, 1) + T.y() * B(1, 1) + T.z() * B(2, 1);
    t = myfabs(s);

    r &= (t <= (b.y() + a.x() * Bf(0, 1) + a.y() * Bf(1, 1) + a.z() * Bf(2, 1)));
    if (!r)
        return false;

    // B0 x B1 = B2
    s = T.x() * B(0, 2) + T.y() * B(1, 2) + T.z() * B(2, 2);
    t = myfabs(s);

    r &= (t <= (b.z() + a.x() * Bf(0, 2) + a.y() * Bf(1, 2) + a.z() * Bf(2, 2)));
    if (!r)
        return false;

    // A0 x B0
    s = T.z() * B(1, 0) - T.y() * B(2, 0);
    t = myfabs(s);

    r &= (t <= (a.y() * Bf(2, 0) + a.z() * Bf(1, 0) + b.y() * Bf(0, 2) +
                b.z() * Bf(0, 1)));
    if (!r)
        return false;

    // A0 x B1
    s = T.z() * B(1, 1) - T.y() * B(2, 1);
    t = myfabs(s);

    r &= (t <= (a.y() * Bf(2, 1) + a.z() * Bf(1, 1) + b.x() * Bf(0, 2) +
                b.z() * Bf(0, 0)));
    if (!r)
        return false;

    // A0 x B2
    s = T.z() * B(1, 2) - T.y() * B(2, 2);
    t = myfabs(s);

    r &= (t <= (a.y() * Bf(2, 2) + a.z() * Bf(1, 2) + b.x() * Bf(0, 1) +
                b.y() * Bf(0, 0)));
    if (!r)
        return false;

    // A1 x B0
    s = T.x() * B(2, 0) - T.z() * B(0, 0);
    t = myfabs(s);

    r &= (t <= (a.x() * Bf(2, 0) + a.z() * Bf(0, 0) + b.y() * Bf(1, 2) +
                b.z() * Bf(1, 1)));
    if (!r)
        return false;

    // A1 x B1
    s = T.x() * B(2, 1) - T.z() * B(0, 1);
    t = myfabs(s);

    r &= (t <= (a.x() * Bf(2, 1) + a.z() * Bf(0, 1) + b.x() * Bf(1, 2) +
                b.z() * Bf(1, 0)));
    if (!r)
        return false;

    // A1 x B2
    s = T.x() * B(2, 2) - T.z() * B(0, 2);
    t = myfabs(s);

    r &= (t <= (a.x() * Bf(2, 2) + a.z() * Bf(0, 2) + b.x() * Bf(1, 1) +
                b.y() * Bf(1, 0)));
    if (!r)
        return false;

    // A2 x B0
    s = T.y() * B(0, 0) - T.x() * B(1, 0);
    t = myfabs(s);

    r &= (t <= (a.x() * Bf(1, 0) + a.y() * Bf(0, 0) + b.y() * Bf(2, 2) +
                b.z() * Bf(2, 1)));
    if (!r)
        return false;

    // A2 x B1
    s = T.y() * B(0, 1) - T.x() * B(1, 1);
    t = myfabs(s);

    r &= (t <= (a.x() * Bf(1, 1) + a.y() * Bf(0, 1) + b.x() * Bf(2, 2) +
                b.z() * Bf(2, 0)));
    if (!r)
        return false;

    // A2 x B2
    s = T.y() * B(0, 2) - T.x() * B(1, 2);
    t = myfabs(s);

    r &= (t <= (a.x() * Bf(1, 2) + a.y() * Bf(0, 2) + b.x() * Bf(2, 1) +
                b.y() * Bf(2, 0)));
    if (!r)
        return false;

    return true;  // no separation: BV collide!!
}